

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils-inl.hpp
# Opt level: O0

int CoreMLConverter::getLayerIndex
              (LayerParameter *caffeLayer,
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *mapCaffeLayerNamesToIndex)

{
  size_t this;
  bool bVar1;
  string *psVar2;
  mapped_type_conflict1 *pmVar3;
  ostream *poVar4;
  runtime_error *this_00;
  string local_1f0 [48];
  stringstream local_1c0 [8];
  stringstream ss;
  ostream local_1b0 [380];
  int local_34;
  const_iterator cStack_30;
  int l;
  _Self local_28;
  ulong local_20;
  size_t layerIndexInWeightsFile;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *mapCaffeLayerNamesToIndex_local;
  LayerParameter *caffeLayer_local;
  
  local_20 = 0;
  layerIndexInWeightsFile = (size_t)mapCaffeLayerNamesToIndex;
  mapCaffeLayerNamesToIndex_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        *)caffeLayer;
  psVar2 = caffe::LayerParameter::name_abi_cxx11_(caffeLayer);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(mapCaffeLayerNamesToIndex,psVar2);
  cStack_30 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     *)layerIndexInWeightsFile);
  bVar1 = std::operator!=(&local_28,&stack0xffffffffffffffd0);
  this = layerIndexInWeightsFile;
  if (!bVar1) {
    std::__cxx11::stringstream::stringstream(local_1c0);
    poVar4 = std::operator<<(local_1b0,"Caffe layer \'");
    psVar2 = caffe::LayerParameter::name_abi_cxx11_
                       ((LayerParameter *)mapCaffeLayerNamesToIndex_local);
    poVar4 = std::operator<<(poVar4,(string *)psVar2);
    poVar4 = std::operator<<(poVar4,
                             "\' is defined in the .prototxt file but is missing from the the .caffemodel file"
                            );
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    std::runtime_error::runtime_error(this_00,local_1f0);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  psVar2 = caffe::LayerParameter::name_abi_cxx11_((LayerParameter *)mapCaffeLayerNamesToIndex_local)
  ;
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 *)this,psVar2);
  local_34 = *pmVar3;
  if (-1 < local_34) {
    local_20 = (ulong)local_34;
    if (local_20 < 0x80000000) {
      return local_34;
    }
    __assert_fail("layerIndexInWeightsFile <= INT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Utils-inl.hpp"
                  ,0xb2,
                  "int CoreMLConverter::getLayerIndex(const caffe::LayerParameter &, const std::map<std::string, int> &)"
                 );
  }
  __assert_fail("l >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/Utils-inl.hpp"
                ,0xaa,
                "int CoreMLConverter::getLayerIndex(const caffe::LayerParameter &, const std::map<std::string, int> &)"
               );
}

Assistant:

inline int getLayerIndex(const caffe::LayerParameter& caffeLayer,
                                             const std::map<std::string, int>& mapCaffeLayerNamesToIndex) {
        
        
        size_t layerIndexInWeightsFile = 0;
        if (mapCaffeLayerNamesToIndex.find(caffeLayer.name()) != mapCaffeLayerNamesToIndex.end()) {
            int l = mapCaffeLayerNamesToIndex.at(caffeLayer.name());
            assert(l >= 0);
            layerIndexInWeightsFile = static_cast<size_t>(l);
        } else {
            std::stringstream ss;
            ss << "Caffe layer '" << caffeLayer.name()
            << "' is defined in the .prototxt file but is missing from the the .caffemodel file" << std::endl;
            throw std::runtime_error(ss.str());
        }
        assert(layerIndexInWeightsFile <= INT_MAX);
        return static_cast<int>(layerIndexInWeightsFile);
        
    }